

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

format_arg * __thiscall
duckdb_fmt::v6::internal::
get_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
          (format_arg *__return_storage_ptr__,internal *this,
          basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
          *ctx,int id)

{
  long lVar1;
  longlong lVar2;
  size_t sVar3;
  uint uVar4;
  type tVar5;
  long *plVar6;
  uint uVar7;
  long *plVar8;
  size_type *psVar9;
  ulong uVar10;
  uint __val;
  uint uVar11;
  string __str;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  uVar11 = (uint)ctx;
  basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  ::do_get(__return_storage_ptr__,
           (basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
            *)(this + 8),uVar11);
  tVar5 = __return_storage_ptr__->type_;
  if (tVar5 == named_arg_type) {
    lVar1 = (__return_storage_ptr__->value_).field_0.long_long_value;
    lVar2 = *(longlong *)(lVar1 + 0x10);
    sVar3 = *(size_t *)(lVar1 + 0x18);
    tVar5 = *(type *)(lVar1 + 0x20);
    __return_storage_ptr__->type_ = tVar5;
    (__return_storage_ptr__->value_).field_0.long_long_value = lVar2;
    (__return_storage_ptr__->value_).field_0.string.size = sVar3;
  }
  if (tVar5 == none_type) {
    __val = -uVar11;
    if (0 < (int)uVar11) {
      __val = uVar11;
    }
    uVar11 = 1;
    if (9 < __val) {
      uVar10 = (ulong)__val;
      uVar4 = 4;
      do {
        uVar11 = uVar4;
        uVar7 = (uint)uVar10;
        if (uVar7 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_00d70271;
        }
        if (uVar7 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_00d70271;
        }
        if (uVar7 < 10000) goto LAB_00d70271;
        uVar10 = uVar10 / 10000;
        uVar4 = uVar11 + 4;
      } while (99999 < uVar7);
      uVar11 = uVar11 + 1;
    }
LAB_00d70271:
    uVar10 = (ulong)ctx >> 0x1f & 1;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct((ulong)local_90,(char)uVar11 + (char)uVar10);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_90[0] + uVar10,uVar11,__val);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x1dac33e);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_60 = *plVar8;
      lStack_58 = plVar6[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar8;
      local_70 = (long *)*plVar6;
    }
    local_68 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar9 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_50.field_2._M_allocated_capacity = *psVar9;
      local_50.field_2._8_8_ = plVar6[3];
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar9;
      local_50._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_50._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>::
    on_error((basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
              *)this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FMT_CONSTEXPR typename Context::format_arg get_arg(Context& ctx, int id) {
  auto arg = ctx.arg(id);
  if (!arg) ctx.on_error("Argument index \"" + std::to_string(id) + "\" out of range");
  return arg;
}